

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O0

void __thiscall
CVmObjPattern::restore_from_file
          (CVmObjPattern *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  CVmObjFixup *in_RCX;
  CVmObjPattern *in_RDI;
  CVmObjTable *unaff_retaddr;
  char buf [5];
  re_compiled_pattern *pat;
  char *in_stack_ffffffffffffffd8;
  CVmObjPattern *pCVar3;
  undefined4 obj;
  
  pCVar3 = in_RDI;
  if ((in_RDI->super_CVmObject).ext_ == (char *)0x0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,0x18,in_RDI);
    (in_RDI->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar1);
  }
  obj = (undefined4)((ulong)pCVar3 >> 0x20);
  CVmFile::read_bytes((CVmFile *)in_RCX,in_stack_ffffffffffffffd8,(size_t)in_RDI);
  CVmObjFixup::fix_dh(in_RCX,in_stack_ffffffffffffffd8);
  pat = (re_compiled_pattern *)&stack0xffffffffffffffdb;
  get_ext(in_RDI);
  vmb_get_dh((char *)in_RDI,(vm_val_t *)pat);
  set_pattern(in_RDI,pat);
  CVmObjTable::request_post_load_init(unaff_retaddr,obj);
  return;
}

Assistant:

void CVmObjPattern::restore_from_file(VMG_ vm_obj_id_t self,
                                      class CVmFile *fp, CVmObjFixup *fixups)
{
    /* if we don't already have an extension, allocate one */
    if (ext_ == 0)
        ext_ = (char *)G_mem->get_var_heap()
               ->alloc_mem(sizeof(vmobj_pat_ext), this);

    /* read the source string reference */
    char buf[VMB_DATAHOLDER];
    fp->read_bytes(buf, VMB_DATAHOLDER);

    /* fix it up */
    fixups->fix_dh(vmg_ buf);

    /* remember it in our extension */
    vmb_get_dh(buf, &get_ext()->str);

    /* 
     *   clear out our pattern and request post-load initialization - we
     *   can't necessarily compile it yet, because we might not have loaded
     *   the source string data, so just make a note that we need to compile
     *   it the next time we need it 
     */
    set_pattern(0);
    G_obj_table->request_post_load_init(self);
}